

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O3

bool __thiscall ON_BrepTrimArray::Write(ON_BrepTrimArray *this,ON_BinaryArchive *file)

{
  uint i;
  ON_BrepTrim *pOVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  
  bVar4 = false;
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
  if (bVar2) {
    bVar3 = 0;
    bVar2 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
    if (bVar2) {
      i = (this->super_ON_ObjectArray<ON_BrepTrim>).super_ON_ClassArray<ON_BrepTrim>.m_count;
      bVar3 = ON_BinaryArchive::WriteInt(file,i);
      if (0 < (int)i && (bool)bVar3) {
        lVar6 = 0;
        uVar5 = 1;
        do {
          pOVar1 = (this->super_ON_ObjectArray<ON_BrepTrim>).super_ON_ClassArray<ON_BrepTrim>.m_a;
          bVar3 = (**(code **)(*(long *)((long)&(((ON_CurveProxy *)
                                                 (&(pOVar1->super_ON_CurveProxy).m_real_curve_domain
                                                 + -2))->super_ON_Curve).super_ON_Geometry.
                                                super_ON_Object._vptr_ON_Object + lVar6) + 0x50))
                            ((long)&(((ON_CurveProxy *)
                                     (&(pOVar1->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                    super_ON_Curve).super_ON_Geometry.super_ON_Object.
                                    _vptr_ON_Object + lVar6,file);
          if (bVar3 == 0) break;
          lVar6 = lVar6 + 0xe8;
          bVar2 = uVar5 < i;
          uVar5 = uVar5 + 1;
        } while (bVar2);
      }
    }
    bVar4 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar4 = (bool)(bVar4 & bVar3);
  }
  return bVar4;
}

Assistant:

bool ON_BrepTrimArray::Write( ON_BinaryArchive& file ) const
{
  int i;
  bool rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
  if (rc) {
    rc = file.Write3dmChunkVersion(1,0);
    const int count = Count();
    if (rc) rc = file.WriteInt( count );
    for ( i = 0; rc && i < count; i++ ) {
      if (rc) rc = m_a[i].Write(file);
    }
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}